

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
           *this,CustomExternalWrapperCallbacks *key,RecyclerWeakReference<Js::DynamicType> **value)

{
  BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  char *pcVar2;
  hash_t hashCode;
  uintptr_t *puVar3;
  uint uVar4;
  RecyclerWeakReference<Js::DynamicType> *pRVar5;
  code *pcVar6;
  long lVar7;
  char cVar8;
  uintptr_t uVar9;
  uintptr_t uVar10;
  uintptr_t uVar11;
  bool bVar12;
  int iVar13;
  undefined4 *puVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  RecyclerWeakReference<Js::DynamicType> *local_60;
  CustomExternalWrapperCallbacks *local_58;
  char *local_50;
  RecyclerWeakReference<Js::DynamicType> *local_48;
  uint local_3c;
  RecyclerWeakReference<Js::DynamicType> **local_38;
  
  lVar18 = *(long *)this;
  local_38 = value;
  if (lVar18 == 0) {
    BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar18 = *(long *)this;
  }
  hashCode = ((uint)key->finalizeCallback ^ (uint)key->traceCallback ^ (uint)key->interceptors ^
             (uint)key->prototype) * 2 + 1;
  local_3c = BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar17 = *(uint *)(lVar18 + (ulong)local_3c * 4);
  if ((int)uVar17 < 0) {
    cVar8 = (char)(uVar17 >> 0x18);
    uVar16 = 0;
  }
  else {
    lVar18 = *(long *)(this + 8);
    uVar16 = 0;
    do {
      lVar15 = (ulong)uVar17 * 0x30;
      pcVar2 = (char *)(lVar18 + lVar15);
      if ((*(uint *)(lVar18 + 0x18 + lVar15) ^ *(uint *)(lVar18 + 0x10 + lVar15) ^
           *(uint *)(lVar18 + 0x20 + lVar15) ^ *(uint *)(lVar18 + 0x28 + lVar15)) ==
          ((uint)key->finalizeCallback ^ (uint)key->traceCallback ^ (uint)key->interceptors ^
          (uint)key->prototype)) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar16);
        }
        pRVar5 = *local_38;
        Memory::Recycler::WBSetBit((char *)&local_60);
        local_60 = pRVar5;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
        pRVar5 = local_60;
        Memory::Recycler::WBSetBit(pcVar2);
        *(RecyclerWeakReference<Js::DynamicType> **)pcVar2 = pRVar5;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
        return uVar17;
      }
      uVar16 = uVar16 + 1;
      uVar17 = *(uint *)(pcVar2 + 8);
    } while (-1 < (int)uVar17);
    cVar8 = (char)(uVar17 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar16);
  }
  if (cVar8 < '\0') {
    if ((*(int *)(this + 0x28) == 0) && (*(int *)(this + 0x20) == *(int *)(this + 0x18))) {
      MapAndRemoveIf<JsUtil::BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>::Insert<(JsUtil::BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>(Js::JavascriptLibrary::CustomExternalWrapperCallbacks_const&,Memory::RecyclerWeakReference<Js::DynamicType>*const&)::_lambda(JsUtil::WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>>&)_1_>
                (this);
    }
    local_58 = key;
    if (*(int *)(this + 0x28) == 0) {
      uVar17 = *(uint *)(this + 0x20);
      if (uVar17 == *(uint *)(this + 0x18)) {
        BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        local_3c = BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
        uVar17 = *(uint *)(this + 0x20);
      }
      *(uint *)(this + 0x20) = uVar17 + 1;
      if (*(int *)(this + 0x18) < (int)(uVar17 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f1,"(count <= size)","count <= size");
        if (!bVar12) goto LAB_00cde91c;
        *puVar14 = 0;
      }
      if (*(int *)(this + 0x18) <= (int)uVar17) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f2,"(index < size)","index < size");
        if (!bVar12) goto LAB_00cde91c;
        *puVar14 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar12) goto LAB_00cde91c;
        *puVar14 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar12) goto LAB_00cde91c;
        *puVar14 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar12) {
LAB_00cde91c:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar14 = 0;
      }
      uVar17 = *(uint *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar13 = BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex
                           ((EntryType *)((long)(int)uVar17 * 0x30 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar13;
      }
    }
    lVar18 = *(long *)(this + 8);
    lVar7 = (long)(int)uVar17 * 0x30;
    local_50 = (char *)(lVar18 + lVar7);
    local_48 = *local_38;
    local_38 = (RecyclerWeakReference<Js::DynamicType> **)(long)(int)uVar17;
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60 = local_48;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    pcVar2 = local_50;
    local_48 = local_60;
    Memory::Recycler::WBSetBit(local_50);
    *(RecyclerWeakReference<Js::DynamicType> **)(lVar18 + lVar7) = local_48;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
    uVar9 = local_58->traceCallback;
    uVar10 = local_58->finalizeCallback;
    uVar11 = local_58->prototype;
    puVar3 = (uintptr_t *)(lVar18 + 0x20 + lVar7);
    *puVar3 = local_58->interceptors;
    puVar3[1] = uVar11;
    puVar3 = (uintptr_t *)(lVar18 + 0x10 + lVar7);
    *puVar3 = uVar9;
    puVar3[1] = uVar10;
    lVar18 = *(long *)this;
    lVar15 = *(long *)(this + 8);
    *(undefined4 *)(lVar15 + 8 + lVar7) = *(undefined4 *)(lVar18 + (ulong)local_3c * 4);
    *(int *)(lVar18 + (ulong)local_3c * 4) = (int)local_38;
    uVar16 = 0;
    uVar4 = uVar17;
    do {
      uVar4 = *(uint *)(lVar15 + 8 + (long)(int)uVar4 * 0x30);
      uVar16 = uVar16 + 1;
    } while (uVar4 != 0xffffffff);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar16);
    }
  }
  return uVar17;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }